

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O1

void updatePred(Graph *G,int *v,vector<bool,_std::allocator<bool>_> *in_R,
               vector<bool,_std::allocator<bool>_> *reached_from_node_in_U,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *pred)

{
  ulong *puVar1;
  pointer psVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer psVar6;
  pointer psVar7;
  AdjList *g;
  int local_4c;
  int *local_48;
  pointer local_40;
  Graph *local_38;
  
  uVar4 = (ulong)*v;
  uVar3 = uVar4 + 0x3f;
  if (-1 < (long)uVar4) {
    uVar3 = uVar4;
  }
  puVar1 = (reached_from_node_in_U->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar3 >> 6) +
           (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)*v & 0x3f);
  psVar2 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = *(pointer *)
            &psVar2[uVar4].super_StoredVertex.m_out_edges.
             super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
  ;
  psVar7 = *(pointer *)
            ((long)&psVar2[uVar4].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
            + 8);
  local_48 = v;
  local_40 = psVar7;
  local_38 = G;
  if (psVar6 != psVar7) {
    do {
      uVar3 = (psVar6->super_stored_edge<unsigned_long>).m_target;
      uVar4 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar4 = uVar3;
      }
      uVar5 = (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001);
      if (((reached_from_node_in_U->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar4 >> 6) + uVar5 + 0xffffffffffffffff] >> (uVar3 & 0x3f) & 1) == 0) {
        if (((in_R->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar4 >> 6) + uVar5 + 0xffffffffffffffff]
            & 1L << ((byte)uVar3 & 0x3f)) != 0) {
          (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar3] = (long)*local_48;
        }
        local_4c = (int)uVar3;
        updatePred(local_38,&local_4c,in_R,reached_from_node_in_U,pred);
        psVar7 = local_40;
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar7);
  }
  return;
}

Assistant:

inline void updatePred(const Graph& G, const int& v,
    std::vector<bool>& in_R,
    std::vector<bool>& reached_from_node_in_U,
    std::vector<unsigned long>& pred)
{ 
    reached_from_node_in_U[v] = true;
    OutEdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = out_edges(v, G); ei != ei_end; ++ei){
        unsigned long w = target(*ei, G);
        if (!reached_from_node_in_U[w]) { 
            if ( in_R[w] ) pred[w] = v;
            updatePred(G, w, in_R, reached_from_node_in_U, pred);
        }
    }
}